

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

bool P_PoisonPlayer(player_t *player,AActor *poisoner,AActor *source,int poison)

{
  uint uVar1;
  FName *other;
  bool bVar2;
  FNameNoInit *local_40;
  TFlags<ActorFlag2,_unsigned_int> local_30;
  int local_2c;
  AActor *pAStack_28;
  int poison_local;
  AActor *source_local;
  AActor *poisoner_local;
  player_t *player_local;
  
  bVar2 = true;
  local_2c = poison;
  pAStack_28 = source;
  source_local = poisoner;
  poisoner_local = (AActor *)player;
  if ((player->cheats & 2U) == 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_30,(int)player->mo + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
    bVar2 = true;
    if (uVar1 == 0) {
      bVar2 = ((poisoner_local->RenderStyle).AsDWORD & 0x2000000) != 0;
    }
  }
  if (bVar2) {
    player_local._7_1_ = false;
  }
  else {
    if (((pAStack_28 != (AActor *)0x0) && ((AActor *)pAStack_28->player != poisoner_local)) &&
       (bVar2 = AActor::IsTeammate((AActor *)
                                   (poisoner_local->super_DThinker).super_DObject._vptr_DObject,
                                   pAStack_28), bVar2)) {
      local_2c = (int)((double)local_2c * level.teamdamage);
    }
    if (0 < local_2c) {
      *(int *)&poisoner_local->subsector = local_2c + *(int *)&poisoner_local->subsector;
      TObjPtr<AActor>::operator=((TObjPtr<AActor> *)&poisoner_local->ceilingz,pAStack_28);
      if (source_local == (AActor *)0x0) {
        other = FName::operator=((FName *)&poisoner_local->floorz,NAME_None);
        FName::operator=((FName *)((long)&poisoner_local->subsector + 4),other);
      }
      else {
        FName::operator=((FName *)((long)&poisoner_local->subsector + 4),
                         &(source_local->DamageType).super_FName);
        bVar2 = FName::operator!=(&(source_local->PainType).super_FName,NAME_None);
        if (bVar2) {
          local_40 = &source_local->PainType;
        }
        else {
          local_40 = &source_local->DamageType;
        }
        FName::operator=((FName *)&poisoner_local->floorz,&local_40->super_FName);
      }
      if (100 < *(int *)&poisoner_local->subsector) {
        *(undefined4 *)&poisoner_local->subsector = 100;
      }
    }
    player_local._7_1_ = true;
  }
  return player_local._7_1_;
}

Assistant:

bool P_PoisonPlayer (player_t *player, AActor *poisoner, AActor *source, int poison)
{
	if((player->cheats&CF_GODMODE) || (player->mo->flags2 & MF2_INVULNERABLE) || (player->cheats & CF_GODMODE2))
	{
		return false;
	}
	if (source != NULL && source->player != player && player->mo->IsTeammate (source))
	{
		poison = (int)(poison * level.teamdamage);
	}
	if (poison > 0)
	{
		player->poisoncount += poison;
		player->poisoner = source;
		if (poisoner == NULL)
		{
			player->poisontype = player->poisonpaintype = NAME_None;
		}
		else
		{ // We need to record these in case the poisoner disappears before poisoncount reaches 0.
			player->poisontype = poisoner->DamageType;
			player->poisonpaintype = poisoner->PainType != NAME_None ? poisoner->PainType : poisoner->DamageType;
		}
		if(player->poisoncount > 100)
		{
			player->poisoncount = 100;
		}
	}
	return true;
}